

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall
QTableViewPrivate::drawAndClipSpans
          (QTableViewPrivate *this,QRegion *area,QPainter *painter,QStyleOptionViewItem *option,
          QBitArray *drawn,int firstVisualRow,int lastVisualRow,int firstVisualColumn,
          int lastVisualColumn)

{
  Span *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ViewItemFeature flag;
  reference ppSVar6;
  Span **ppSVar7;
  ulong uVar8;
  QRegion *in_RDX;
  QRect *in_RSI;
  QTableViewPrivate *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int vc;
  int c;
  int vr;
  int r;
  int col;
  int row;
  Span *span_1;
  add_const_t<QSet<QSpanCollection::Span_*>_> *__range1;
  int spanVisualBottom;
  int spanVisualRight;
  int spanVisualTop;
  int spanVisualLeft;
  SpanList *__range2;
  bool sectionMoved;
  bool alternateBase;
  QTableView *q;
  QRect rect;
  QModelIndex index;
  const_iterator __end1;
  const_iterator __begin1;
  Span *span;
  const_iterator __end2;
  const_iterator __begin2;
  SpanList spanList;
  QSet<QSpanCollection::Span_*> visibleSpans;
  QRegion region;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem *in_stack_fffffffffffffd88;
  QRegion *this_01;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  Span **in_stack_fffffffffffffda0;
  QAbstractItemModel *pQVar9;
  int in_stack_fffffffffffffda8;
  undefined1 on;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  QStyleOptionViewItem *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 uVar10;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  int local_21c;
  QRegion local_1a8;
  undefined1 local_1a0 [16];
  QPersistentModelIndex local_190 [3];
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  Span *local_130;
  _Self local_128;
  _Self local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_f8;
  QRect local_f0;
  QRegion local_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_e0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  local_f0 = QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8))
  ;
  QRegion::QRegion(&local_e0,(QRect *)&local_f0,Rectangle);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QSpanCollection::Span_*>::QSet((QSet<QSpanCollection::Span_*> *)0x8b4269);
  bVar1 = QHeaderView::sectionsMoved
                    ((QHeaderView *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  uVar10 = true;
  if (!bVar1) {
    uVar10 = QHeaderView::sectionsMoved
                       ((QHeaderView *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                       );
  }
  if ((bool)uVar10 == false) {
    in_stack_fffffffffffffdb8 = (QStyleOptionViewItem *)&in_RDI->spans;
    in_stack_fffffffffffffdc4 =
         logicalColumn((QTableViewPrivate *)
                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    logicalRow((QTableViewPrivate *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    QSpanCollection::spansInRect
              ((QSpanCollection *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
    QSet<QSpanCollection::Span_*>::operator=
              ((QSet<QSpanCollection::Span_*> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (QSet<QSpanCollection::Span_*> *)in_stack_fffffffffffffd88);
    QSet<QSpanCollection::Span_*>::~QSet((QSet<QSpanCollection::Span_*> *)0x8b434d);
  }
  else {
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_120._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_120._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::
         begin((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    local_128._M_node = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
    local_128._M_node =
         (_List_node_base *)
         std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::end
                   ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)
                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    while (bVar1 = std::operator!=(&local_120,&local_128), bVar1) {
      ppSVar6 = std::_List_const_iterator<QSpanCollection::Span_*>::operator*
                          ((_List_const_iterator<QSpanCollection::Span_*> *)0x8b442d);
      local_130 = *ppSVar6;
      QSpanCollection::Span::left(local_130);
      iVar5 = visualColumn((QTableViewPrivate *)
                           CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      QSpanCollection::Span::top(local_130);
      iVar2 = visualRow((QTableViewPrivate *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
      in_stack_fffffffffffffdb0 = iVar5;
      iVar3 = QSpanCollection::Span::width(local_130);
      iVar3 = in_stack_fffffffffffffdb0 + iVar3;
      in_stack_fffffffffffffdb4 = iVar2;
      iVar4 = QSpanCollection::Span::height(local_130);
      if ((((iVar5 <= in_stack_00000018) && (in_stack_00000010 <= iVar3 + -1)) &&
          (iVar2 <= in_stack_00000008)) && (in_R9D <= in_stack_fffffffffffffdb4 + iVar4 + -1)) {
        QSet<QSpanCollection::Span_*>::insert
                  ((QSet<QSpanCollection::Span_*> *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda0);
      }
      std::_List_const_iterator<QSpanCollection::Span_*>::operator++(&local_120);
    }
    std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::~list
              ((list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *)0x8b453e);
  }
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QSpanCollection::Span_*>::begin
            ((QSet<QSpanCollection::Span_*> *)
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  local_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QSpanCollection::Span_*>::end
            ((QSet<QSpanCollection::Span_*> *)
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  while (bVar1 = QSet<QSpanCollection::Span_*>::const_iterator::operator!=
                           ((const_iterator *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (const_iterator *)in_stack_fffffffffffffd88), bVar1) {
    ppSVar7 = QSet<QSpanCollection::Span_*>::const_iterator::operator*((const_iterator *)0x8b45e5);
    this_00 = *ppSVar7;
    iVar5 = QSpanCollection::Span::top(this_00);
    flag = QSpanCollection::Span::left(this_00);
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = (in_RDI->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_190);
    (**(code **)(*(long *)pQVar9 + 0x60))(&local_178,pQVar9,iVar5,flag,local_190);
    on = (undefined1)((uint)iVar5 >> 0x18);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
    ;
    if (bVar1) {
      local_1a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0 = (undefined1  [16])
                  visualSpanRect((QTableViewPrivate *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                 (Span *)CONCAT17(uVar10,in_stack_fffffffffffffdd0));
      QRect::translate((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (QPoint *)in_stack_fffffffffffffd88);
      uVar8 = QRegion::intersects(in_RSI);
      if ((uVar8 & 1) != 0) {
        memset(local_d8,0xaa,0xd0);
        QStyleOptionViewItem::QStyleOptionViewItem
                  ((QStyleOptionViewItem *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd88);
        local_c8 = local_1a0._0_8_;
        local_c0 = local_1a0._8_8_;
        if (((in_RDI->super_QAbstractItemViewPrivate).alternatingColors & 1U) != 0) {
          QSpanCollection::Span::top(this_00);
        }
        QFlags<QStyleOptionViewItem::ViewItemFeature>::setFlag
                  ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
                   CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),flag,(bool)on);
        drawCell(in_RDI,(QPainter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdb8,
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        if ((in_RDI->showGrid & 1U) != 0) {
          iVar5 = QHeaderView::visualIndex
                            ((QHeaderView *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
          if (iVar5 == 0) {
            QRect::top((QRect *)0x8b4819);
            QRect::setTop((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
          }
          iVar5 = QHeaderView::visualIndex
                            ((QHeaderView *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4);
          if (iVar5 == 0) {
            bVar1 = QWidget::isLeftToRight((QWidget *)0x8b4852);
            if (bVar1) {
              QRect::left((QRect *)0x8b4865);
              QRect::setLeft((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
            }
            else {
              QRect::right((QRect *)0x8b4886);
              QRect::setRight((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                              ,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
            }
          }
        }
        QRegion::QRegion(&local_1a8,(QRect *)local_1a0,Rectangle);
        QRegion::operator-=(&local_e0,(QRegion *)&local_1a8);
        QRegion::~QRegion(&local_1a8);
        for (local_21c = QSpanCollection::Span::top(this_00);
            iVar5 = QSpanCollection::Span::bottom(this_00), local_21c <= iVar5;
            local_21c = local_21c + 1) {
          iVar5 = visualRow((QTableViewPrivate *)
                            CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
          if ((in_R9D <= iVar5) && (iVar5 <= in_stack_00000008)) {
            in_stack_fffffffffffffd94 = QSpanCollection::Span::left(this_00);
            while (in_stack_fffffffffffffddc = in_stack_fffffffffffffd94,
                  iVar5 = QSpanCollection::Span::right(this_00), in_stack_fffffffffffffd94 <= iVar5)
            {
              in_stack_fffffffffffffdd8 =
                   visualColumn((QTableViewPrivate *)
                                CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
              if ((in_stack_00000010 <= in_stack_fffffffffffffdd8) &&
                 (in_stack_fffffffffffffdd8 <= in_stack_00000018)) {
                QBitArray::setBit((QBitArray *)in_stack_fffffffffffffd88,0x8b49c6);
              }
              in_stack_fffffffffffffd94 = in_stack_fffffffffffffddc + 1;
            }
          }
        }
        QStyleOptionViewItem::~QStyleOptionViewItem
                  ((QStyleOptionViewItem *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      }
    }
    QSet<QSpanCollection::Span_*>::const_iterator::operator++
              ((const_iterator *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  this_01 = &local_e0;
  QPainter::setClipRegion(in_RDX,(ClipOperation)this_01);
  QSet<QSpanCollection::Span_*>::~QSet((QSet<QSpanCollection::Span_*> *)0x8b4a32);
  QRegion::~QRegion(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::drawAndClipSpans(const QRegion &area, QPainter *painter,
                                         const QStyleOptionViewItem &option, QBitArray *drawn,
                                         int firstVisualRow, int lastVisualRow, int firstVisualColumn, int lastVisualColumn)
{
    Q_Q(const QTableView);
    bool alternateBase = false;
    QRegion region = viewport->rect();

    QSet<QSpanCollection::Span *> visibleSpans;
    bool sectionMoved = verticalHeader->sectionsMoved() || horizontalHeader->sectionsMoved();

    if (!sectionMoved) {
        visibleSpans = spans.spansInRect(logicalColumn(firstVisualColumn), logicalRow(firstVisualRow),
                                         lastVisualColumn - firstVisualColumn + 1, lastVisualRow - firstVisualRow + 1);
    } else {
        // Any cell outside the viewport, on the top or left, can still end up visible inside the
        // viewport if is has a span. Calculating if a spanned cell overlaps with the viewport is
        // "easy" enough when the columns (or rows) in the view are aligned with the columns
        // in the model; In that case you know that if a column is outside the viewport on the
        // right, it cannot affect the drawing of the cells inside the viewport, even with a span.
        // And under that assumption, the spansInRect() function can be used (which is optimized
        // to only iterate the spans that are close to the viewport).
        // But when the view has rearranged the columns (or rows), this is no longer true. In that
        // case, even if a column, according to the model, is outside the viewport on the right, it
        // can still overlap with the viewport. This can happen if it was moved to the left of the
        // viewport and one of its cells has a span. In that case we need to take the theoretically
        // slower route and iterate through all the spans, and check if any of them overlaps with
        // the viewport.
        const auto spanList = spans.spans;
        for (QSpanCollection::Span *span : spanList) {
            const int spanVisualLeft = visualColumn(span->left());
            const int spanVisualTop = visualRow(span->top());
            const int spanVisualRight = spanVisualLeft + span->width() - 1;
            const int spanVisualBottom = spanVisualTop + span->height() - 1;
            if ((spanVisualLeft <= lastVisualColumn && spanVisualRight >= firstVisualColumn)
                    && (spanVisualTop <= lastVisualRow && spanVisualBottom >= firstVisualRow))
                visibleSpans.insert(span);
        }
    }

    for (QSpanCollection::Span *span : std::as_const(visibleSpans)) {
        int row = span->top();
        int col = span->left();
        QModelIndex index = model->index(row, col, root);
        if (!index.isValid())
            continue;
        QRect rect = visualSpanRect(*span);
        rect.translate(scrollDelayOffset);
        if (!area.intersects(rect))
            continue;
        QStyleOptionViewItem opt = option;
        opt.rect = rect;
        alternateBase = alternatingColors && (span->top() & 1);
        opt.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);
        drawCell(painter, opt, index);
        if (showGrid) {
            // adjust the clip rect to be able to paint the top & left grid lines
            // if the headers are not visible, see paintEvent()
            if (horizontalHeader->visualIndex(row) == 0)
                rect.setTop(rect.top() + 1);
            if (verticalHeader->visualIndex(row) == 0) {
                if (q->isLeftToRight())
                    rect.setLeft(rect.left() + 1);
                else
                    rect.setRight(rect.right() - 1);
            }
        }
        region -= rect;
        for (int r = span->top(); r <= span->bottom(); ++r) {
            const int vr = visualRow(r);
            if (vr < firstVisualRow || vr > lastVisualRow)
                continue;
            for (int c = span->left(); c <= span->right(); ++c) {
                const int vc = visualColumn(c);
                if (vc < firstVisualColumn  || vc > lastVisualColumn)
                    continue;
                drawn->setBit((vr - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                             + vc - firstVisualColumn);
            }
        }

    }
    painter->setClipRegion(region);
}